

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

bool __thiscall glu::ContextInfo::isCompressedTextureFormatSupported(ContextInfo *this,int format)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  set<int,_std::less<int>,_std::allocator<int>_> *local_20;
  set<int,_std::less<int>,_std::allocator<int>_> *formats;
  ContextInfo *pCStack_10;
  int format_local;
  ContextInfo *this_local;
  
  formats._4_4_ = format;
  pCStack_10 = this;
  local_20 = CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
             ::getValue(&this->m_compressedTextureFormats,this->m_context);
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (local_20,(key_type_conflict *)((long)&formats + 4));
  local_30._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(local_20);
  bVar1 = std::operator!=(&local_28,&local_30);
  return bVar1;
}

Assistant:

bool ContextInfo::isCompressedTextureFormatSupported (int format) const
{
	const set<int>& formats = m_compressedTextureFormats.getValue(m_context);
	return formats.find(format) != formats.end();
}